

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O2

void __thiscall
Net::Net(Net *this,int input_size,int output_size,int hidden_layers_amount,
        vector<int,_std::allocator<int>_> *hidden_layers,int _function_type)

{
  pointer pvVar1;
  result_type_conflict rVar2;
  Net *pNVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  pointer pvVar5;
  long lVar6;
  size_type sVar7;
  int x_1;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int x;
  long lVar11;
  allocator_type local_1459;
  Net *local_1458;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_1450;
  pointer local_1448;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_1440;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_1438;
  value_type_conflict2 local_1430;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_1428;
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *local_1420;
  vector<int,_std::allocator<int>_> *local_1418;
  long local_1410;
  _Vector_base<double,_std::allocator<double>_> local_1408;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_13f0;
  uniform_real_distribution<double> local_13e8;
  Table *local_13d8;
  Table *local_13d0;
  size_type local_13c8;
  size_type local_13c0;
  mt19937 rnd;
  
  this->function_type = SIGMOID;
  this->MOD = 100.0;
  local_13d0 = &this->samples;
  local_1418 = hidden_layers;
  Table::Table(local_13d0);
  local_13d8 = &this->answers;
  Table::Table(local_13d8);
  (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->shuffler).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1450 = &this->mesh;
  local_13f0 = &this->meshZ;
  local_1440 = &this->biases;
  local_1428 = &this->init_biases;
  local_1438 = &this->weights;
  local_1420 = &this->init;
  memset(local_1450,0,0x90);
  this->function_type = _function_type;
  local_1458 = this;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&rnd,0x4b);
  if (1 < input_size) {
    sVar7 = (size_type)(hidden_layers_amount + 2);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(local_1450,sVar7);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::resize(local_1420,sVar7);
    std::
    vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
    ::resize(local_1438,sVar7);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(local_1428,sVar7);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(local_1440,sVar7);
    std::vector<double,_std::allocator<double>_>::resize
              ((local_1450->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,(ulong)(uint)input_size);
    std::vector<double,_std::allocator<double>_>::resize
              ((local_1458->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,(long)output_size);
    local_13e8._M_param._M_a = 0.0;
    local_13e8._M_param._M_b._0_4_ = 0;
    local_13e8._M_param._M_b._4_4_ = 0x3ff00000;
    if (local_1458->function_type == TANH) {
      local_13e8._M_param._M_a = -1.0;
    }
    pvVar5 = (local_1450->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar9 = 1;
    local_13c8 = (long)output_size;
    while( true ) {
      pvVar4 = local_1418;
      lVar6 = (long)(local_1458->mesh).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar5;
      if ((int)(lVar6 / 0x18) + -1 <= lVar9) break;
      std::vector<double,_std::allocator<double>_>::resize
                (pvVar5 + lVar9,
                 (long)(local_1418->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar9 + -1]);
      lVar6 = lVar9 + -1;
      local_1448 = (local_1420->
                   super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
      local_13c0 = (size_type)
                   (pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar9 + -1];
      pvVar5 = (local_1450->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1430 = 0.0;
      local_1410 = lVar9;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_1408,
                 (long)*(pointer *)
                        ((long)&pvVar5[lVar6].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&pvVar5[lVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data >> 3,&local_1430,&local_1459);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::_M_fill_assign(local_1448 + lVar9,local_13c0,(value_type *)&local_1408);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1408);
      pvVar1 = (local_1438->
               super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1448 = (pointer)(long)(local_1418->super__Vector_base<int,_std::allocator<int>_>).
                                  _M_impl.super__Vector_impl_data._M_start[local_1410 + -1];
      pvVar5 = (local_1450->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_1408,
                 (long)*(pointer *)
                        ((long)&pvVar5[lVar6].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&pvVar5[lVar6].super__Vector_base<double,_std::allocator<double>_>._M_impl
                           .super__Vector_impl_data >> 3,(allocator_type *)&local_1430);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::resize(pvVar1 + lVar9,(size_type)local_1448,(value_type *)&local_1408);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1408);
      lVar8 = local_1410;
      pvVar4 = local_1418;
      std::vector<double,_std::allocator<double>_>::resize
                ((local_1440->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar9,
                 (long)(local_1418->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[local_1410 + -1]);
      std::vector<double,_std::allocator<double>_>::resize
                ((local_1428->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + lVar9,
                 (long)(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar8 + -1]);
      pvVar5 = (local_1450->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      for (local_1448 = (pointer)0x0;
          local_1448 <
          (ulong)((long)*(pointer *)
                         ((long)&pvVar5[lVar9].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data + 8) -
                  *(long *)&pvVar5[lVar9].super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data >> 3);
          local_1448 = (pointer)((long)local_1448 + 1)) {
        rVar2 = std::uniform_real_distribution<double>::operator()(&local_13e8,&rnd);
        *(result_type_conflict *)
         (*(long *)&(local_1440->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar9].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + (long)local_1448 * 8) = rVar2;
        lVar8 = (long)local_1448 * 0x18;
        for (lVar11 = 0;
            pvVar5 = (local_1450->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
            lVar11 < (int)((ulong)((long)*(pointer *)
                                          ((long)&pvVar5[lVar6].
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data + 8) -
                                  *(long *)&pvVar5[lVar6].
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data) >> 3);
            lVar11 = lVar11 + 1) {
          rVar2 = std::uniform_real_distribution<double>::operator()(&local_13e8,&rnd);
          *(result_type_conflict *)
           (*(long *)(*(long *)&(local_1438->
                                super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar9].
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar8) + lVar11 * 8) = rVar2;
        }
      }
      lVar9 = local_1410 + 1;
    }
    pvVar1 = (local_1458->weights).
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_1408,
               *(long *)((long)pvVar5 + lVar6 + -0x28) - *(long *)((long)pvVar5 + lVar6 + -0x30) >>
               3,(allocator_type *)&local_1430);
    sVar7 = local_13c8;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(pvVar1 + -1,local_13c8,(value_type *)&local_1408);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1408);
    pvVar1 = (local_1458->init).
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar5 = (local_1458->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1430 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_1408,
               (long)pvVar5[-2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)pvVar5[-2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,&local_1430,&local_1459);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::_M_fill_assign(pvVar1 + -1,sVar7,(value_type *)&local_1408);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1408);
    pNVar3 = local_1458;
    std::vector<double,_std::allocator<double>_>::resize
              ((local_1458->biases).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,sVar7);
    std::vector<double,_std::allocator<double>_>::resize
              ((pNVar3->init_biases).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,sVar7);
    pvVar5 = (pNVar3->mesh).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (uVar10 = 0;
        uVar10 < (ulong)((long)pvVar5[-1].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)pvVar5[-1].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3); uVar10 = uVar10 + 1)
    {
      rVar2 = std::uniform_real_distribution<double>::operator()(&local_13e8,&rnd);
      (local_1458->biases).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1].
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [uVar10] = rVar2;
      for (lVar9 = 0;
          pvVar5 = (local_1458->mesh).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          lVar9 < (int)((ulong)((long)pvVar5[-2].super__Vector_base<double,_std::allocator<double>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)pvVar5[-2].super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 3);
          lVar9 = lVar9 + 1) {
        rVar2 = std::uniform_real_distribution<double>::operator()(&local_13e8,&rnd);
        *(result_type_conflict *)
         (*(long *)&(local_1458->weights).
                    super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1].
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar10].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data + lVar9 * 8) = rVar2;
      }
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator=(local_13f0,local_1450);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Minimum input size is 2\n");
  exit(1);
}

Assistant:

Net::Net(int input_size, int output_size, int hidden_layers_amount, const std::vector<int>& hidden_layers, int _function_type) {
    function_type = (FUNCTIONS)_function_type;
    std::mt19937 rnd(75);
    if (input_size < 2){
        std::cerr << "Minimum input size is 2\n";
        exit(EXIT_FAILURE);
    }
    mesh.resize(2 + hidden_layers_amount);
    init.resize(2 + hidden_layers_amount);
    weights.resize(2 + hidden_layers_amount);
    init_biases.resize(2 + hidden_layers_amount);
    biases.resize(2 + hidden_layers_amount);
    mesh[0].resize(input_size);
    mesh.back().resize(output_size);

    auto dist = std::uniform_real_distribution<double>(0.0, 1.0);
    if (function_type == TANH)
        dist = std::uniform_real_distribution<double>(-1.0, 1.0);
    for (int i = 1; i < (int)mesh.size()-1; ++i){
        mesh[i].resize(hidden_layers[i - 1]);
        init[i].assign(hidden_layers[i - 1], std::vector<double>(mesh[i-1].size(), 0));
        weights[i].resize(hidden_layers[i - 1], std::vector<double>(mesh[i-1].size()));
        biases[i].resize(hidden_layers[i - 1]);
        init_biases[i].resize(hidden_layers[i - 1]);
        for (int j = 0; j < mesh[i].size(); ++j) {
            biases[i][j] = dist(rnd);
            for (int x = 0; x < (int) mesh[i - 1].size(); ++x)
                weights[i][j][x] = dist(rnd);
        }
    }
    weights.back().resize(output_size, std::vector<double>(mesh[mesh.size()-2].size()));
    init.back().assign(output_size, std::vector<double>(mesh[mesh.size()-2].size(), 0));
    biases.back().resize(output_size);
    init_biases.back().resize(output_size);
    for (int j = 0; j < mesh.back().size(); ++j) {
        biases.back()[j] = dist(rnd);
        for (int x = 0; x < (int) mesh[mesh.size() - 2].size(); ++x)
            weights.back()[j][x] = dist(rnd);
    }
    meshZ = mesh;
}